

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O3

void lf::assemble::test::linfe_boundary_assembly
               (shared_ptr<lf::mesh::Mesh> *mesh_p,DofHandler *dof_handler)

{
  element_type *peVar1;
  undefined8 uVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined1 uVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar9;
  Scalar *pSVar10;
  ulong row;
  char *pcVar11;
  ulong uVar12;
  ulong col;
  size_type N_dofs;
  SparseMatrix<double,_0,_int> Galerkin_matrix;
  BoundaryAssembler assembler;
  MatrixXd ref_mat;
  MatrixXd dense_Gal_mat;
  uint local_4b4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4b0;
  COOMatrix<double> local_4a8;
  DofHandler *local_488;
  AssertHelper local_480;
  void *local_478;
  iterator iStack_470;
  uint *local_468;
  undefined1 local_460 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  undefined1 local_440 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  pointer pTStack_430;
  pointer local_428;
  StorageIndex *local_420;
  CompressedStorage<double,_int> local_418;
  shared_ptr<lf::mesh::Mesh> local_3f8;
  undefined1 local_3e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  undefined **local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  pointer local_3a0;
  stored_size_type local_390;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_378;
  void *local_358 [3];
  Scalar local_340;
  Scalar local_338;
  Scalar local_330;
  Scalar local_328;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  Scalar local_308;
  Scalar local_300;
  Scalar local_2f8;
  Scalar local_2f0;
  Scalar local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  Scalar local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  Scalar local_288;
  Scalar local_280;
  Scalar local_278;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  undefined1 *local_230;
  Scalar local_228;
  Scalar local_220;
  Scalar local_218;
  Scalar local_210;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  undefined1 *local_1e8;
  Scalar local_1e0;
  Scalar local_1d8;
  Scalar local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  Scalar local_1b8;
  Scalar local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  Scalar local_198;
  Scalar local_190;
  Scalar local_188;
  Scalar local_180;
  Scalar local_178;
  Scalar local_170;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  long *plVar8;
  
  local_488 = dof_handler;
  local_4b4 = (*dof_handler->_vptr_DofHandler[2])(dof_handler);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," degrees of freedom in linear FE space",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_440._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_3e8,"N_dofs","10",&local_4b4,(int *)local_440);
  if (local_3e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_440._4_4_,local_440._0_4_) + 0x10),
               "Dubious numbers of dofs",0x17);
    if (local_3e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_3e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
               ,0x213,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4a8,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4a8);
    if ((long *)CONCAT44(local_440._4_4_,local_440._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_440._4_4_,local_440._0_4_) + 8))();
    }
  }
  if (local_3e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3e0,local_3e0);
  }
  local_478 = (void *)0x0;
  iStack_470._M_current = (uint *)0x0;
  local_468 = (uint *)0x0;
  if (local_4b4 != 0) {
    uVar12 = 0;
    do {
      iVar6 = (*local_488->_vptr_DofHandler[7])(local_488,uVar12);
      plVar8 = (long *)CONCAT44(extraout_var,iVar6);
      uVar5 = (**(code **)(*plVar8 + 0x20))(plVar8);
      local_3e8[0] = (internal)uVar5;
      local_4a8.rows_._0_1_ = 1;
      testing::internal::CmpHelperEQ<lf::base::RefEl,lf::base::RefEl>
                ((internal *)local_440,"e.RefEl()","lf::base::RefEl::kPoint()",(RefEl *)local_3e8,
                 (RefEl *)&local_4a8);
      if (local_440[0] == false) {
        testing::Message::Message((Message *)&local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8._0_8_ + 0x10),"dofs @ ",7);
        local_460[0] = (**(code **)(*plVar8 + 0x20))(plVar8);
        uVar2 = local_4a8._0_8_;
        base::RefEl::ToString_abi_cxx11_((string *)local_3e8,(RefEl *)local_460);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(uVar2 + 0x10),(char *)CONCAT44(local_3e8._4_4_,local_3e8._0_4_),
                   (long)local_3e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_3e8._4_4_,local_3e8._0_4_) != &local_3d8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_3e8._4_4_,local_3e8._0_4_),
                          local_3d8._M_allocated_capacity + 1);
        }
        pcVar11 = "";
        if (local_438 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_438->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_3e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                   ,0x219,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_3e8,(Message *)&local_4a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3e8);
        if ((AssertHelperData *)local_4a8._0_8_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_4a8._0_8_ + 8))();
        }
      }
      if (local_438 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_438,local_438);
      }
      peVar1 = (mesh_p->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_3e8._0_4_ = (*peVar1->_vptr_Mesh[5])(peVar1,plVar8);
      if (iStack_470._M_current == local_468) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_478,iStack_470,
                   (uint *)local_3e8);
      }
      else {
        *iStack_470._M_current = local_3e8._0_4_;
        iStack_470._M_current = iStack_470._M_current + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dof ",4);
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," @node ",7);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      uVar12 = uVar12 + 1;
    } while (uVar12 < local_4b4);
  }
  local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh_p->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh_p->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  BoundaryAssembler::BoundaryAssembler((BoundaryAssembler *)local_3e8,&local_3f8);
  if (local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_4a8.cols_ = local_4b4;
  local_4a8.rows_ = local_4b4;
  local_4a8.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::assemble::test::BoundaryAssembler>
            ((COOMatrix<double> *)local_440,1,local_488,local_488,(BoundaryAssembler *)local_3e8);
  pTVar4 = local_4a8.triplets_.
           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar3 = local_4a8.triplets_.
           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4a8._0_8_ = CONCAT44(local_440._4_4_,local_440._0_4_);
  local_4a8.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_438;
  local_4a8.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pTStack_430;
  local_4a8.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_428;
  local_438 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pTStack_430 = (pointer)0x0;
  local_428 = (pointer)0x0;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
    if (local_438 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_438,(long)local_428 - (long)local_438);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Assembled ",10);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," matrix",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  COOMatrix<double>::makeSparse((SparseMatrix<double,_0,_int> *)local_440,&local_4a8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::SparseMatrix<double,0,int>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_358,
             (EigenBase<Eigen::SparseMatrix<double,_0,_int>_> *)local_440);
  poVar7 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_358);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_378.m_storage.m_data = (double *)0x0;
  local_378.m_storage.m_rows = 0;
  local_378.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_378,10,10);
  local_4b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_460,
             (Matrix<double,__1,__1,_0,__1,__1> *)&local_378,(Scalar *)&local_4b0);
  local_480.data_ = (AssertHelperData *)0x0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_460,
                      (Scalar *)&local_480);
  local_38 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_38);
  local_40 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_40);
  local_48 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_48);
  local_50 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_50);
  local_58 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_58);
  local_60 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_60);
  local_68 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_68);
  local_70 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_70);
  local_78 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_78);
  local_80 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_80);
  local_88 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_88);
  local_90 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_90);
  local_98 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_98);
  local_a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_a0);
  local_a8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_a8);
  local_b0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_b0);
  local_b8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_b8);
  local_c0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_c0);
  local_c8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_c8);
  local_d0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_d0);
  local_d8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_d8);
  local_e0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_e0);
  local_e8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_e8);
  local_f0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_f0);
  local_f8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_f8);
  local_100 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_100);
  local_108 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_108);
  local_110 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_110);
  local_118 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_118);
  local_120 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_120);
  local_128 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_128);
  local_130 = 23.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_130);
  local_138 = -11.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_138);
  local_140 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_140);
  local_148 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_148);
  local_150 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_150);
  local_158 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_158);
  local_160 = -12.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_160);
  local_168 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_168);
  local_170 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_170);
  local_178 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_178);
  local_180 = -11.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_180);
  local_188 = 24.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_188);
  local_190 = -13.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_190);
  local_198 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_198);
  local_1a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1a0);
  local_1a8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1a8);
  local_1b0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1b0);
  local_1b8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1b8);
  local_1c0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1c0);
  local_1c8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1c8);
  local_1d0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1d0);
  local_1d8 = -13.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1d8);
  local_1e0 = 27.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1e0);
  local_1e8 = &DAT_c02c000000000000;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,(Scalar *)&local_1e8);
  local_1f0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1f0);
  local_1f8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1f8);
  local_200 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_200);
  local_208 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_208);
  local_210 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_210);
  local_218 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_218);
  local_220 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_220);
  local_228 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_228);
  local_230 = &DAT_c02c000000000000;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,(Scalar *)&local_230);
  local_238 = 29.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_238);
  local_240 = -15.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_240);
  local_248 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_248);
  local_250 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_250);
  local_258 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_258);
  local_260 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_260);
  local_268 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_268);
  local_270 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_270);
  local_278 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_278);
  local_280 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_280);
  local_288 = -15.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_288);
  local_290 = 31.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_290);
  local_298 = -16.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_298);
  local_2a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2a0);
  local_2a8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2a8);
  local_2b0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2b0);
  local_2b8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2b8);
  local_2c0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2c0);
  local_2c8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2c8);
  local_2d0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2d0);
  local_2d8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2d8);
  local_2e0 = -16.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2e0);
  local_2e8 = 33.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2e8);
  local_2f0 = -17.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2f0);
  local_2f8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2f8);
  local_300 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_300);
  local_308 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_308);
  local_310 = -12.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_310);
  local_318 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_318);
  local_320 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_320);
  local_328 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_328);
  local_330 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_330);
  local_338 = -17.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_338);
  local_340 = 29.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_340);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_460);
  if (local_4b4 != 0) {
    uVar12 = 1;
    row = 0;
    do {
      iVar6 = (int)uVar12;
      uVar12 = 0;
      if (iVar6 != 0) {
        col = 0;
        do {
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                               local_358,row,col);
          local_488 = (DofHandler *)*pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                               &local_378,(ulong)*(uint *)((long)local_478 + row * 4),
                               (ulong)*(uint *)((long)local_478 + col * 4));
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)local_460,"dense_Gal_mat(i, j)",
                     "ref_mat(dof_to_entity_index[i], dof_to_entity_index[j])",(double)local_488,
                     *pSVar10);
          if (local_460[0] == 0) {
            testing::Message::Message((Message *)&local_4b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_4b0._M_head_impl + 0x10)," mismatch in entry (",0x14);
            std::ostream::operator<<(local_4b0._M_head_impl + 0x10,(int)row);
            local_480.data_._0_1_ = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_4b0._M_head_impl + 0x10),(char *)&local_480,1);
            std::ostream::operator<<(local_4b0._M_head_impl + 0x10,(int)col);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_4b0._M_head_impl + 0x10),")",1);
            pcVar11 = "";
            if (local_458 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar11 = (local_458->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_480,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                       ,0x23e,pcVar11);
            testing::internal::AssertHelper::operator=(&local_480,(Message *)&local_4b0);
            testing::internal::AssertHelper::~AssertHelper(&local_480);
            if (local_4b0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
            }
          }
          if (local_458 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_458,local_458);
          }
          col = col + 1;
          uVar12 = (ulong)local_4b4;
        } while (col < uVar12);
      }
      row = row + 1;
    } while (row < uVar12);
  }
  free(local_378.m_storage.m_data);
  free(local_358[0]);
  free(local_428);
  free(local_420);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_418);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_4a8.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4a8.triplets_.
                    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4a8.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4a8.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3b8 = &PTR_operator___0029e110;
  if (local_390 != 0) {
    operator_delete(local_3a0,local_390 << 2);
  }
  if (local_3a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a8._M_pi);
  }
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
  }
  if (local_478 != (void *)0x0) {
    operator_delete(local_478,(long)local_468 - (long)local_478);
  }
  return;
}

Assistant:

void linfe_boundary_assembly(std::shared_ptr<lf::mesh::Mesh> mesh_p,
                             const lf::assemble::DofHandler &dof_handler) {
  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());

  std::cout << N_dofs << " degrees of freedom in linear FE space" << std::endl;
  EXPECT_EQ(N_dofs, 10) << "Dubious numbers of dofs";

  // Output/store index numbers of entities holding global shape functions
  std::vector<lf::base::glb_idx_t> dof_to_entity_index{};
  for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
    const lf::mesh::Entity &e(dof_handler.Entity(dof_idx));
    EXPECT_EQ(e.RefEl(), lf::base::RefEl::kPoint()) << "dofs @ " << e.RefEl();
    const lf::base::glb_idx_t e_idx(mesh_p->Index(e));
    dof_to_entity_index.push_back(e_idx);
    std::cout << "dof " << dof_idx << " @node " << e_idx << std::endl;
  }

  // Test assembler
  BoundaryAssembler assembler{mesh_p};
  lf::assemble::COOMatrix<double> mat(N_dofs, N_dofs);

  // Assembly over edges
  mat = lf::assemble::AssembleMatrixLocally<lf::assemble::COOMatrix<double>>(
      1, dof_handler, assembler);

  std::cout << "Assembled " << mat.rows() << "x" << mat.cols() << " matrix"
            << std::endl;

  // Build sparse matrix from COO format
  Eigen::SparseMatrix<double> Galerkin_matrix = mat.makeSparse();

  // Convert Galerkin matrix to a dense matrix
  Eigen::MatrixXd dense_Gal_mat = Galerkin_matrix;

  // Output Galerkin matrix
  std::cout << dense_Gal_mat << std::endl;

  // Reference Galerkin matrix
  Eigen::MatrixXd ref_mat(10, 10);
  ref_mat << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 23, -11, 0, 0, 0, 0, -12, 0, 0, 0, -11,
      24, -13, 0, 0, 0, 0, 0, 0, 0, 0, -13, 27, -14, 0, 0, 0, 0, 0, 0, 0, 0,
      -14, 29, -15, 0, 0, 0, 0, 0, 0, 0, 0, -15, 31, -16, 0, 0, 0, 0, 0, 0, 0,
      0, -16, 33, -17, 0, 0, 0, -12, 0, 0, 0, 0, -17, 29;

  for (int i = 0; i < N_dofs; ++i) {
    for (int j = 0; j < N_dofs; ++j) {
      EXPECT_DOUBLE_EQ(dense_Gal_mat(i, j),
                       ref_mat(dof_to_entity_index[i], dof_to_entity_index[j]))
          << " mismatch in entry (" << i << ',' << j << ")";
    }
  }
}